

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O1

void __thiscall
pica::Grid<(pica::Dimension)3,_double>::Grid
          (Grid<(pica::Dimension)3,_double> *this,PositionType *origin,PositionType *step,
          IndexType *size)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  vector<double,_std::allocator<double>_> *this_00;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  double dVar21;
  allocator_type local_69;
  value_type local_68;
  vector<double,_std::allocator<double>_> *local_60;
  vector<double,_std::allocator<double>_> *local_58;
  vector<double,_std::allocator<double>_> *local_50;
  vector<double,_std::allocator<double>_> *local_48;
  vector<double,_std::allocator<double>_> *local_40;
  PositionType *local_38;
  
  uVar3 = size->x;
  uVar12 = size->y;
  iVar2 = size->z;
  local_68 = 0.0;
  (this->exData).size.x = uVar3;
  (this->exData).size.y = uVar12;
  (this->exData).size.z = iVar2;
  pvVar1 = &(this->exData).data;
  local_38 = step;
  std::vector<double,_std::allocator<double>_>::vector
            (pvVar1,(long)(uVar3 * iVar2 * uVar12),&local_68,&local_69);
  uVar4 = size->x;
  uVar13 = size->y;
  iVar2 = size->z;
  local_68 = 0.0;
  (this->eyData).size.x = uVar4;
  (this->eyData).size.y = uVar13;
  (this->eyData).size.z = iVar2;
  this_00 = &(this->eyData).data;
  local_40 = pvVar1;
  std::vector<double,_std::allocator<double>_>::vector
            (this_00,(long)(uVar4 * iVar2 * uVar13),&local_68,&local_69);
  uVar5 = size->x;
  uVar14 = size->y;
  iVar2 = size->z;
  local_68 = 0.0;
  (this->ezData).size.x = uVar5;
  (this->ezData).size.y = uVar14;
  (this->ezData).size.z = iVar2;
  pvVar1 = &(this->ezData).data;
  local_48 = this_00;
  std::vector<double,_std::allocator<double>_>::vector
            (pvVar1,(long)(uVar5 * iVar2 * uVar14),&local_68,&local_69);
  uVar6 = size->x;
  uVar15 = size->y;
  iVar2 = size->z;
  local_68 = 0.0;
  (this->bxData).size.x = uVar6;
  (this->bxData).size.y = uVar15;
  (this->bxData).size.z = iVar2;
  local_58 = &(this->bxData).data;
  local_50 = pvVar1;
  std::vector<double,_std::allocator<double>_>::vector
            (local_58,(long)(uVar6 * iVar2 * uVar15),&local_68,&local_69);
  uVar7 = size->x;
  uVar16 = size->y;
  iVar2 = size->z;
  local_68 = 0.0;
  (this->byData).size.x = uVar7;
  (this->byData).size.y = uVar16;
  (this->byData).size.z = iVar2;
  local_60 = &(this->byData).data;
  std::vector<double,_std::allocator<double>_>::vector
            (local_60,(long)(uVar7 * iVar2 * uVar16),&local_68,&local_69);
  uVar8 = size->x;
  uVar17 = size->y;
  iVar2 = size->z;
  local_68 = 0.0;
  (this->bzData).size.x = uVar8;
  (this->bzData).size.y = uVar17;
  (this->bzData).size.z = iVar2;
  std::vector<double,_std::allocator<double>_>::vector
            (&(this->bzData).data,(long)(uVar8 * iVar2 * uVar17),&local_68,&local_69);
  uVar9 = size->x;
  uVar18 = size->y;
  iVar2 = size->z;
  local_68 = 0.0;
  (this->jxData).size.x = uVar9;
  (this->jxData).size.y = uVar18;
  (this->jxData).size.z = iVar2;
  std::vector<double,_std::allocator<double>_>::vector
            (&(this->jxData).data,(long)(uVar9 * iVar2 * uVar18),&local_68,&local_69);
  uVar10 = size->x;
  uVar19 = size->y;
  iVar2 = size->z;
  local_68 = 0.0;
  (this->jyData).size.x = uVar10;
  (this->jyData).size.y = uVar19;
  (this->jyData).size.z = iVar2;
  std::vector<double,_std::allocator<double>_>::vector
            (&(this->jyData).data,(long)(uVar10 * iVar2 * uVar19),&local_68,&local_69);
  uVar11 = size->x;
  uVar20 = size->y;
  iVar2 = size->z;
  local_68 = 0.0;
  (this->jzData).size.x = uVar11;
  (this->jzData).size.y = uVar20;
  (this->jzData).size.z = iVar2;
  std::vector<double,_std::allocator<double>_>::vector
            (&(this->jzData).data,(long)(uVar11 * iVar2 * uVar20),&local_68,&local_69);
  (this->origin).z = origin->z;
  dVar21 = origin->y;
  (this->origin).x = origin->x;
  (this->origin).y = dVar21;
  dVar21 = local_38->y;
  (this->step).x = local_38->x;
  (this->step).y = dVar21;
  (this->step).z = local_38->z;
  return;
}

Assistant:

Grid(const PositionType& origin, const PositionType& step, const IndexType& size) :
        exData(size),
        eyData(size),
        ezData(size),
        bxData(size),
        byData(size),
        bzData(size),
        jxData(size),
        jyData(size),
        jzData(size),
        origin(origin),
        step(step) {}